

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<char,_void_(*)(char_*,_unsigned_long)> * __thiscall
Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::operator=
          (Array<char,_void_(*)(char_*,_unsigned_long)> *this,
          Array<char,_void_(*)(char_*,_unsigned_long)> *other)

{
  Array<char,_void_(*)(char_*,_unsigned_long)> *other_local;
  Array<char,_void_(*)(char_*,_unsigned_long)> *this_local;
  
  Utility::swap<char*>(&this->_data,&other->_data);
  Utility::swap<unsigned_long>(&this->_size,&other->_size);
  Utility::swap<void(*)(char*,unsigned_long)>(&this->_deleter,&other->_deleter);
  return this;
}

Assistant:

inline Array<T, D>& Array<T, D>::operator=(Array<T, D>&& other) noexcept {
    using Utility::swap;
    swap(_data, other._data);
    swap(_size, other._size);
    swap(_deleter, other._deleter);
    return *this;
}